

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O0

bool __thiscall
lunasvg::SVGPreserveAspectRatio::parse(SVGPreserveAspectRatio *this,string_view input)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  MeetOrSlice local_d4;
  undefined1 local_d0 [4];
  MeetOrSlice meetOrSlice;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  int local_2c;
  SVGPreserveAspectRatio *pSStack_28;
  AlignType alignType;
  SVGPreserveAspectRatio *this_local;
  string_view input_local;
  
  input_local._M_len = (size_t)input._M_str;
  this_local = (SVGPreserveAspectRatio *)input._M_len;
  local_2c = 5;
  pSStack_28 = this;
  stripLeadingSpaces((string_view *)&this_local);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"none");
  bVar1 = skipString((string_view *)&this_local,&local_40);
  if (bVar1) {
    local_2c = 0;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"xMinYMin");
    bVar1 = skipString((string_view *)&this_local,&local_50);
    if (bVar1) {
      local_2c = 1;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,"xMidYMin")
      ;
      bVar1 = skipString((string_view *)&this_local,&local_60);
      if (bVar1) {
        local_2c = 2;
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_70,"xMaxYMin");
        bVar1 = skipString((string_view *)&this_local,&local_70);
        if (bVar1) {
          local_2c = 3;
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_80,"xMinYMid");
          bVar1 = skipString((string_view *)&this_local,&local_80);
          if (bVar1) {
            local_2c = 4;
          }
          else {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_90,"xMidYMid");
            bVar1 = skipString((string_view *)&this_local,&local_90);
            if (bVar1) {
              local_2c = 5;
            }
            else {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_a0,"xMaxYMid");
              bVar1 = skipString((string_view *)&this_local,&local_a0);
              if (bVar1) {
                local_2c = 6;
              }
              else {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_b0,"xMinYMax");
                bVar1 = skipString((string_view *)&this_local,&local_b0);
                if (bVar1) {
                  local_2c = 7;
                }
                else {
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (&local_c0,"xMidYMax");
                  bVar1 = skipString((string_view *)&this_local,&local_c0);
                  if (bVar1) {
                    local_2c = 8;
                  }
                  else {
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_d0,
                               "xMaxYMax");
                    bVar1 = skipString((string_view *)&this_local,(string_view *)local_d0);
                    if (!bVar1) {
                      return false;
                    }
                    local_2c = 9;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  local_d4 = Meet;
  skipOptionalSpaces((string_view *)&this_local);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e8,"meet");
  bVar1 = skipString((string_view *)&this_local,&local_e8);
  if (bVar1) {
    local_d4 = Meet;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f8,"slice");
    bVar1 = skipString((string_view *)&this_local,&local_f8);
    if (bVar1) {
      local_d4 = Slice;
    }
  }
  if (local_2c == 0) {
    local_d4 = Meet;
  }
  skipOptionalSpaces((string_view *)&this_local);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (bVar1) {
    *(int *)&(this->super_SVGProperty).field_0xc = local_2c;
    this->m_meetOrSlice = local_d4;
  }
  return bVar1;
}

Assistant:

bool SVGPreserveAspectRatio::parse(std::string_view input)
{
    auto alignType = AlignType::xMidYMid;
    stripLeadingSpaces(input);
    if(skipString(input, "none"))
        alignType = AlignType::None;
    else if(skipString(input, "xMinYMin"))
        alignType = AlignType::xMinYMin;
    else if(skipString(input, "xMidYMin"))
        alignType = AlignType::xMidYMin;
    else if(skipString(input, "xMaxYMin"))
        alignType = AlignType::xMaxYMin;
    else if(skipString(input, "xMinYMid"))
        alignType = AlignType::xMinYMid;
    else if(skipString(input, "xMidYMid"))
        alignType = AlignType::xMidYMid;
    else if(skipString(input, "xMaxYMid"))
        alignType = AlignType::xMaxYMid;
    else if(skipString(input, "xMinYMax"))
        alignType = AlignType::xMinYMax;
    else if(skipString(input, "xMidYMax"))
        alignType = AlignType::xMidYMax;
    else if(skipString(input, "xMaxYMax"))
        alignType = AlignType::xMaxYMax;
    else {
        return false;
    }

    auto meetOrSlice = MeetOrSlice::Meet;
    skipOptionalSpaces(input);
    if(skipString(input, "meet")) {
        meetOrSlice = MeetOrSlice::Meet;
    } else if(skipString(input, "slice")) {
        meetOrSlice = MeetOrSlice::Slice;
    }

    if(alignType == AlignType::None)
        meetOrSlice = MeetOrSlice::Meet;
    skipOptionalSpaces(input);
    if(!input.empty())
        return false;
    m_alignType = alignType;
    m_meetOrSlice = meetOrSlice;
    return true;
}